

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_internal.h
# Opt level: O0

ImGuiTable * __thiscall ImPool<ImGuiTable>::Add(ImPool<ImGuiTable> *this)

{
  ImGuiTable *pIVar1;
  ImVector<ImGuiTable> *in_RDI;
  int idx;
  undefined8 in_stack_ffffffffffffffc8;
  ImVector<ImGuiTable> *in_stack_ffffffffffffffd0;
  undefined4 in_stack_fffffffffffffff0;
  int i;
  
  i = in_RDI[2].Size;
  if (i == in_RDI->Size) {
    ImVector<ImGuiTable>::resize
              (in_stack_ffffffffffffffd0,(int)((ulong)in_stack_ffffffffffffffc8 >> 0x20));
    in_RDI[2].Size = in_RDI[2].Size + 1;
  }
  else {
    pIVar1 = ImVector<ImGuiTable>::operator[](in_RDI,i);
    in_RDI[2].Size = pIVar1->ID;
  }
  ImVector<ImGuiTable>::operator[](in_RDI,i);
  operator_new(600);
  ImGuiTable::ImGuiTable((ImGuiTable *)CONCAT44(i,in_stack_fffffffffffffff0));
  pIVar1 = ImVector<ImGuiTable>::operator[](in_RDI,i);
  return pIVar1;
}

Assistant:

T*          Add()                               { int idx = FreeIdx; if (idx == Buf.Size) { Buf.resize(Buf.Size + 1); FreeIdx++; } else { FreeIdx = *(int*)&Buf[idx]; } IM_PLACEMENT_NEW(&Buf[idx]) T(); return &Buf[idx]; }